

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

void __thiscall Assimp::JSONWriter::EndObj(JSONWriter *this)

{
  std::__cxx11::string::_M_erase((ulong)&this->indent,(this->indent)._M_string_length - 1);
  if ((this->flags & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x58,(this->indent)._M_dataplus._M_p,
               (this->indent)._M_string_length);
  }
  this->first = false;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x58,"}\n",2);
  return;
}

Assistant:

void EndObj() {
        PopIndent();
        AddIndentation();
        first = false;
        buff << "}\n";
    }